

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramid.cc
# Opt level: O0

void __thiscall
ParamMeasure::walkforward(ParamMeasure *this,WalkState *state,PcodeOp *ignoreop,Varnode *vn)

{
  PcodeOp *this_00;
  bool bVar1;
  OpCode OVar2;
  int4 iVar3;
  reference ppPVar4;
  TypeOp *this_01;
  BlockBasic *this_02;
  Varnode *vn_00;
  bool local_59;
  OpCode oc;
  PcodeOp *op;
  _Self local_30;
  const_iterator iter;
  Varnode *vn_local;
  PcodeOp *ignoreop_local;
  WalkState *state_local;
  ParamMeasure *this_local;
  
  state->depth = state->depth + 1;
  if (state->depth < 10) {
    iter._M_node = (_List_node_base *)vn;
    local_30._M_node = (_List_node_base *)Varnode::beginDescend(vn);
    while( true ) {
      local_59 = false;
      if (this->rank != state->terminalrank) {
        op = (PcodeOp *)Varnode::endDescend((Varnode *)iter._M_node);
        local_59 = std::operator!=(&local_30,(_Self *)&op);
      }
      if (local_59 == false) break;
      ppPVar4 = std::_List_const_iterator<PcodeOp_*>::operator*(&local_30);
      this_00 = *ppPVar4;
      if (this_00 != ignoreop) {
        this_01 = PcodeOp::getOpcode(this_00);
        OVar2 = TypeOp::getOpcode(this_01);
        switch(OVar2) {
        case CPUI_BRANCH:
        case CPUI_BRANCHIND:
          iVar3 = PcodeOp::getSlot(this_00,(Varnode *)iter._M_node);
          if (iVar3 == 0) {
            updaterank(this,DIRECTREAD,(bool)(state->best & 1));
          }
          break;
        case CPUI_CBRANCH:
          iVar3 = PcodeOp::getSlot(this_00,(Varnode *)iter._M_node);
          if (iVar3 < 2) {
            updaterank(this,DIRECTREAD,(bool)(state->best & 1));
          }
          break;
        case CPUI_CALL:
        case CPUI_CALLIND:
          iVar3 = PcodeOp::getSlot(this_00,(Varnode *)iter._M_node);
          if (iVar3 == 0) {
            updaterank(this,DIRECTREAD,(bool)(state->best & 1));
          }
          else {
            this->numcalls = this->numcalls + 1;
            updaterank(this,SUBFNPARAM,(bool)(state->best & 1));
          }
          break;
        case CPUI_CALLOTHER:
          updaterank(this,DIRECTREAD,(bool)(state->best & 1));
          break;
        case CPUI_RETURN:
          updaterank(this,SUBFNRETURN,(bool)(state->best & 1));
          break;
        default:
          updaterank(this,DIRECTREAD,(bool)(state->best & 1));
          break;
        case CPUI_MULTIEQUAL:
          this_02 = PcodeOp::getParent(this_00);
          iVar3 = PcodeOp::getSlot(this_00,(Varnode *)iter._M_node);
          bVar1 = FlowBlock::isLoopIn(&this_02->super_FlowBlock,iVar3);
          if (!bVar1) {
            vn_00 = PcodeOp::getOut(this_00);
            walkforward(this,state,(PcodeOp *)0x0,vn_00);
          }
          break;
        case CPUI_INDIRECT:
          updaterank(this,INDIRECT,(bool)(state->best & 1));
        }
      }
      std::_List_const_iterator<PcodeOp_*>::operator++(&local_30,0);
    }
    state->depth = state->depth + -1;
  }
  else {
    state->depth = state->depth + -1;
  }
  return;
}

Assistant:

void ParamMeasure::walkforward( WalkState &state, PcodeOp *ignoreop, Varnode *vn )

{
  state.depth += 1;
  if (state.depth >= MAXDEPTH) {
    state.depth -= 1;
    return;
  }
  list<PcodeOp *>::const_iterator iter = vn->beginDescend();
  while( rank != state.terminalrank && iter != vn->endDescend() ) {
    PcodeOp *op = *iter;
    if( op != ignoreop ) {
      OpCode oc = op->getOpcode()->getOpcode();
      switch( oc ) {
      case CPUI_BRANCH:
      case CPUI_BRANCHIND:
	if( op->getSlot(vn) == 0 ) updaterank( DIRECTREAD, state.best );
	break;
      case CPUI_CBRANCH:
        if( op->getSlot(vn) < 2 ) updaterank( DIRECTREAD, state.best );
        break;
      case CPUI_CALL:
      case CPUI_CALLIND:
        if( op->getSlot(vn) == 0 ) updaterank( DIRECTREAD, state.best );
        else {
          numcalls++;
          updaterank( SUBFNPARAM, state.best );
        }
        break;
      case CPUI_CALLOTHER:
        updaterank( DIRECTREAD, state.best );
        break;
      case CPUI_RETURN:
        updaterank( THISFNRETURN, state.best );
        break;
      case CPUI_INDIRECT:
        updaterank( INDIRECT, state.best );
        break;
      case CPUI_MULTIEQUAL:
        // The only op for which there can be a loop in the graph is with the MULTIEQUAL (not for CALL, etc.).
        // Walk forward only if the path is not part of a loop.
        if( !op->getParent()->isLoopIn(op->getSlot(vn)) ) walkforward( state, (PcodeOp *)0, op->getOut() );
        break;
      default:
        updaterank( DIRECTREAD, state.best );
        break;
      }
    }
    iter++;
  }
  state.depth -= 1;
}